

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Shader>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Shader *shader,
               string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  Variability VVar2;
  int iVar3;
  pointer_conflict ppVar4;
  Attribute *this;
  value_type *this_00;
  string *psVar5;
  ostream *poVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_10ef0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_10ed0 [32];
  ostringstream aoStack_10eb0 [8];
  ostringstream ss_e_15;
  undefined1 auStack_10d38 [8];
  ShaderNode surface_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abStack_105e8 [32];
  ostringstream aoStack_105c8 [8];
  ostringstream ss_e_14;
  undefined1 auStack_10450 [8];
  UsdTransform2d transform;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f080 [32];
  ostringstream local_f060 [8];
  ostringstream ss_e_13;
  undefined1 local_eee8 [8];
  UsdPrimvarReader_point preader_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e080 [32];
  ostringstream local_e060 [8];
  ostringstream ss_e_12;
  undefined1 local_dee8 [8];
  UsdPrimvarReader_normal preader_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d080 [32];
  ostringstream local_d060 [8];
  ostringstream ss_e_11;
  undefined1 local_cee8 [8];
  UsdPrimvarReader_vector preader_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c080 [32];
  ostringstream local_c060 [8];
  ostringstream ss_e_10;
  undefined1 local_bee8 [8];
  UsdPrimvarReader_string preader_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b068 [32];
  ostringstream local_b048 [8];
  ostringstream ss_e_9;
  undefined1 local_aed0 [8];
  UsdPrimvarReader_float4 preader_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a060 [32];
  ostringstream local_a040 [8];
  ostringstream ss_e_8;
  undefined1 local_9ec8 [8];
  UsdPrimvarReader_float3 preader_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9060 [32];
  ostringstream local_9040 [8];
  ostringstream ss_e_7;
  undefined1 local_8ec8 [8];
  UsdPrimvarReader_float2 preader_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8060 [32];
  ostringstream local_8040 [8];
  ostringstream ss_e_6;
  undefined1 local_7ec8 [8];
  UsdPrimvarReader_float preader_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7068 [32];
  ostringstream local_7048 [8];
  ostringstream ss_e_5;
  undefined1 local_6ed0 [8];
  UsdPrimvarReader_int preader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6070 [32];
  ostringstream local_6050 [8];
  ostringstream ss_e_4;
  undefined1 local_5ed8 [8];
  UsdUVTexture texture;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38d8 [32];
  ostringstream local_38b8 [8];
  ostringstream ss_e_3;
  undefined1 local_3740 [8];
  UsdPreviewSurface surface;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0 [32];
  ostringstream local_7c0 [8];
  ostringstream ss_e_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628 [32];
  ostringstream local_608 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470 [32];
  ostringstream local_450 [8];
  ostringstream ss_e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0 [32];
  ostringstream local_290 [8];
  ostringstream ss_e;
  optional<tinyusdz::Token> local_118;
  undefined1 local_f0 [8];
  optional<tinyusdz::Token> pv;
  Attribute *attr;
  string shader_type;
  allocator local_71;
  key_type_conflict local_70;
  _Self local_50;
  const_iterator info_id_prop;
  bool is_generic_shader;
  string *err_local;
  string *warn_local;
  Shader *shader_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  info_id_prop._M_node._7_1_ = 0;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_70,"info:id",&local_71);
  local_50._M_node =
       (_Base_ptr)
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
       ::find(properties,&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
  shader_type.field_2._8_8_ =
       ::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
       ::end(properties);
  bVar1 = ::std::operator==(&local_50,(_Self *)((long)&shader_type.field_2 + 8));
  if (bVar1) {
    info_id_prop._M_node._7_1_ = 1;
  }
  ::std::__cxx11::string::string((string *)&attr);
  if ((info_id_prop._M_node._7_1_ & 1) == 0) {
    ppVar4 = ::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
             ::operator->(&local_50);
    bVar1 = Property::is_attribute(&ppVar4->second);
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_7c0);
      poVar6 = ::std::operator<<((ostream *)local_7c0,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x127c);
      ::std::operator<<(poVar6," ");
      poVar6 = ::std::operator<<((ostream *)local_7c0,
                                 "Invalid type or value for `info:id` property in `Shader`.");
      ::std::operator<<(poVar6,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_7e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (surface.outputsDisplacement._actual_type_name.field_2._M_local_buf + 8));
        ::std::__cxx11::string::operator=((string *)err,(string *)local_7e0);
        ::std::__cxx11::string::~string((string *)local_7e0);
        ::std::__cxx11::string::~string
                  ((string *)
                   (surface.outputsDisplacement._actual_type_name.field_2._M_local_buf + 8));
      }
      spec_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_7c0);
      goto LAB_002dfd54;
    }
    ppVar4 = ::std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
             ::operator->(&local_50);
    this = Property::get_attribute(&ppVar4->second);
    Attribute::type_name_abi_cxx11_((string *)((long)&pv.contained + 0x18),this);
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&pv.contained + 0x18),"token");
    ::std::__cxx11::string::~string((string *)((long)&pv.contained + 0x18));
    if (!bVar1) {
      ::std::__cxx11::ostringstream::ostringstream(local_450);
      poVar6 = ::std::operator<<((ostream *)local_450,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1274);
      ::std::operator<<(poVar6," ");
      poVar6 = ::std::operator<<((ostream *)local_450,"`info:id` attribute must be `token` type.");
      ::std::operator<<(poVar6,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_470,local_490);
        ::std::__cxx11::string::operator=((string *)err,(string *)local_470);
        ::std::__cxx11::string::~string((string *)local_470);
        ::std::__cxx11::string::~string((string *)local_490);
      }
      spec_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_450);
      goto LAB_002dfd54;
    }
    Attribute::get_value<tinyusdz::Token>(&local_118,this);
    nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
              ((optional<tinyusdz::Token> *)local_f0,&local_118);
    nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&local_118);
    bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_f0);
    if (bVar1) {
      this_00 = nonstd::optional_lite::optional<tinyusdz::Token>::value
                          ((optional<tinyusdz::Token> *)local_f0);
      psVar5 = Token::str_abi_cxx11_(this_00);
      ::std::__cxx11::string::operator=((string *)&attr,(string *)psVar5);
      bVar1 = false;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_290);
      poVar6 = ::std::operator<<((ostream *)local_290,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1271);
      ::std::operator<<(poVar6," ");
      poVar6 = ::std::operator<<((ostream *)local_290,"Internal errror. `info:id` has invalid type."
                                );
      ::std::operator<<(poVar6,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_2b0,local_2d0);
        ::std::__cxx11::string::operator=((string *)err,(string *)local_2b0);
        ::std::__cxx11::string::~string((string *)local_2b0);
        ::std::__cxx11::string::~string((string *)local_2d0);
      }
      spec_local._7_1_ = 0;
      bVar1 = true;
      ::std::__cxx11::ostringstream::~ostringstream(local_290);
    }
    nonstd::optional_lite::optional<tinyusdz::Token>::~optional
              ((optional<tinyusdz::Token> *)local_f0);
    if (bVar1) goto LAB_002dfd54;
    VVar2 = Attribute::variability(this);
    if (VVar2 != Uniform) {
      ::std::__cxx11::ostringstream::ostringstream(local_608);
      poVar6 = ::std::operator<<((ostream *)local_608,"[warn]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1279);
      ::std::operator<<(poVar6," ");
      poVar6 = ::std::operator<<((ostream *)local_608,
                                 "`info:id` attribute must have `uniform` variability.");
      ::std::operator<<(poVar6,"\n");
      if (warn != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_628,local_648);
        ::std::__cxx11::string::operator=((string *)warn,(string *)local_628);
        ::std::__cxx11::string::~string((string *)local_628);
        ::std::__cxx11::string::~string((string *)local_648);
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_608);
    }
  }
  iVar3 = ::std::__cxx11::string::compare((char *)&attr);
  if (iVar3 == 0) {
    UsdPreviewSurface::UsdPreviewSurface((UsdPreviewSurface *)local_3740);
    bVar1 = ReconstructShader<tinyusdz::UsdPreviewSurface>
                      (spec,properties,references,(UsdPreviewSurface *)local_3740,warn,err,options);
    if (bVar1) {
      ::std::__cxx11::string::operator=((string *)&shader->info_id,"UsdPreviewSurface");
      tinyusdz::value::Value::operator=(&shader->value,(UsdPreviewSurface *)local_3740);
      bVar1 = false;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_38b8);
      poVar6 = ::std::operator<<((ostream *)local_38b8,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1287);
      ::std::operator<<(poVar6," ");
      poVar6 = ::std::operator<<((ostream *)local_38b8,"Failed to Reconstruct ");
      poVar6 = ::std::operator<<(poVar6,"UsdPreviewSurface");
      ::std::operator<<(poVar6,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_38d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (texture.outputsRGB._actual_type_name.field_2._M_local_buf + 8));
        ::std::__cxx11::string::operator=((string *)err,(string *)local_38d8);
        ::std::__cxx11::string::~string((string *)local_38d8);
        ::std::__cxx11::string::~string
                  ((string *)(texture.outputsRGB._actual_type_name.field_2._M_local_buf + 8));
      }
      spec_local._7_1_ = 0;
      bVar1 = true;
      ::std::__cxx11::ostringstream::~ostringstream(local_38b8);
    }
    UsdPreviewSurface::~UsdPreviewSurface((UsdPreviewSurface *)local_3740);
    if (bVar1) goto LAB_002dfd54;
  }
  else {
    iVar3 = ::std::__cxx11::string::compare((char *)&attr);
    if (iVar3 == 0) {
      UsdUVTexture::UsdUVTexture((UsdUVTexture *)local_5ed8);
      bVar1 = ReconstructShader<tinyusdz::UsdUVTexture>
                        (spec,properties,references,(UsdUVTexture *)local_5ed8,warn,err,options);
      if (bVar1) {
        ::std::__cxx11::string::operator=((string *)&shader->info_id,"UsdUVTexture");
        tinyusdz::value::Value::operator=(&shader->value,(UsdUVTexture *)local_5ed8);
        bVar1 = false;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_6050);
        poVar6 = ::std::operator<<((ostream *)local_6050,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1290);
        ::std::operator<<(poVar6," ");
        poVar6 = ::std::operator<<((ostream *)local_6050,"Failed to Reconstruct ");
        poVar6 = ::std::operator<<(poVar6,"UsdUVTexture");
        ::std::operator<<(poVar6,"\n");
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_6070,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (preader.result._actual_type_name.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=((string *)err,(string *)local_6070);
          ::std::__cxx11::string::~string((string *)local_6070);
          ::std::__cxx11::string::~string
                    ((string *)(preader.result._actual_type_name.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        bVar1 = true;
        ::std::__cxx11::ostringstream::~ostringstream(local_6050);
      }
      UsdUVTexture::~UsdUVTexture((UsdUVTexture *)local_5ed8);
      if (bVar1) goto LAB_002dfd54;
    }
    else {
      iVar3 = ::std::__cxx11::string::compare((char *)&attr);
      if (iVar3 == 0) {
        UsdPrimvarReader<int>::UsdPrimvarReader((UsdPrimvarReader<int> *)local_6ed0);
        bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<int>>
                          (spec,properties,references,(UsdPrimvarReader_int *)local_6ed0,warn,err,
                           options);
        if (bVar1) {
          ::std::__cxx11::string::operator=((string *)&shader->info_id,"UsdPrimvarReader_int");
          tinyusdz::value::Value::operator=(&shader->value,(UsdPrimvarReader<int> *)local_6ed0);
          bVar1 = false;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_7048);
          poVar6 = ::std::operator<<((ostream *)local_7048,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1299);
          ::std::operator<<(poVar6," ");
          poVar6 = ::std::operator<<((ostream *)local_7048,"Failed to Reconstruct ");
          poVar6 = ::std::operator<<(poVar6,"UsdPrimvarReader_int");
          ::std::operator<<(poVar6,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_7068,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (preader_1.result._actual_type_name.field_2._M_local_buf + 8));
            ::std::__cxx11::string::operator=((string *)err,(string *)local_7068);
            ::std::__cxx11::string::~string((string *)local_7068);
            ::std::__cxx11::string::~string
                      ((string *)(preader_1.result._actual_type_name.field_2._M_local_buf + 8));
          }
          spec_local._7_1_ = 0;
          bVar1 = true;
          ::std::__cxx11::ostringstream::~ostringstream(local_7048);
        }
        UsdPrimvarReader<int>::~UsdPrimvarReader((UsdPrimvarReader<int> *)local_6ed0);
        if (bVar1) goto LAB_002dfd54;
      }
      else {
        iVar3 = ::std::__cxx11::string::compare((char *)&attr);
        if (iVar3 == 0) {
          UsdPrimvarReader<float>::UsdPrimvarReader((UsdPrimvarReader<float> *)local_7ec8);
          bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<float>>
                            (spec,properties,references,(UsdPrimvarReader_float *)local_7ec8,warn,
                             err,options);
          if (bVar1) {
            ::std::__cxx11::string::operator=((string *)&shader->info_id,"UsdPrimvarReader_float");
            tinyusdz::value::Value::operator=(&shader->value,(UsdPrimvarReader<float> *)local_7ec8);
            bVar1 = false;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_8040);
            poVar6 = ::std::operator<<((ostream *)local_8040,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x12a2);
            ::std::operator<<(poVar6," ");
            poVar6 = ::std::operator<<((ostream *)local_8040,"Failed to Reconstruct ");
            poVar6 = ::std::operator<<(poVar6,"UsdPrimvarReader_float");
            ::std::operator<<(poVar6,"\n");
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::operator+(local_8060,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (preader_2.result._actual_type_name.field_2._M_local_buf + 8));
              ::std::__cxx11::string::operator=((string *)err,(string *)local_8060);
              ::std::__cxx11::string::~string((string *)local_8060);
              ::std::__cxx11::string::~string
                        ((string *)(preader_2.result._actual_type_name.field_2._M_local_buf + 8));
            }
            spec_local._7_1_ = 0;
            bVar1 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_8040);
          }
          UsdPrimvarReader<float>::~UsdPrimvarReader((UsdPrimvarReader<float> *)local_7ec8);
          if (bVar1) goto LAB_002dfd54;
        }
        else {
          iVar3 = ::std::__cxx11::string::compare((char *)&attr);
          if (iVar3 == 0) {
            UsdPrimvarReader<std::array<float,_2UL>_>::UsdPrimvarReader
                      ((UsdPrimvarReader<std::array<float,_2UL>_> *)local_8ec8);
            bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,2ul>>>
                              (spec,properties,references,(UsdPrimvarReader_float2 *)local_8ec8,warn
                               ,err,options);
            if (bVar1) {
              ::std::__cxx11::string::operator=
                        ((string *)&shader->info_id,"UsdPrimvarReader_float2");
              tinyusdz::value::Value::operator=
                        (&shader->value,(UsdPrimvarReader<std::array<float,_2UL>_> *)local_8ec8);
              bVar1 = false;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_9040);
              poVar6 = ::std::operator<<((ostream *)local_9040,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x12ab);
              ::std::operator<<(poVar6," ");
              poVar6 = ::std::operator<<((ostream *)local_9040,"Failed to Reconstruct ");
              poVar6 = ::std::operator<<(poVar6,"UsdPrimvarReader_float2");
              ::std::operator<<(poVar6,"\n");
              if (err != (string *)0x0) {
                ::std::__cxx11::ostringstream::str();
                ::std::operator+(local_9060,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(preader_3.result._actual_type_name.field_2._M_local_buf + 8));
                ::std::__cxx11::string::operator=((string *)err,(string *)local_9060);
                ::std::__cxx11::string::~string((string *)local_9060);
                ::std::__cxx11::string::~string
                          ((string *)(preader_3.result._actual_type_name.field_2._M_local_buf + 8));
              }
              spec_local._7_1_ = 0;
              bVar1 = true;
              ::std::__cxx11::ostringstream::~ostringstream(local_9040);
            }
            UsdPrimvarReader<std::array<float,_2UL>_>::~UsdPrimvarReader
                      ((UsdPrimvarReader<std::array<float,_2UL>_> *)local_8ec8);
            if (bVar1) goto LAB_002dfd54;
          }
          else {
            iVar3 = ::std::__cxx11::string::compare((char *)&attr);
            if (iVar3 == 0) {
              UsdPrimvarReader<std::array<float,_3UL>_>::UsdPrimvarReader
                        ((UsdPrimvarReader<std::array<float,_3UL>_> *)local_9ec8);
              bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,3ul>>>
                                (spec,properties,references,(UsdPrimvarReader_float3 *)local_9ec8,
                                 warn,err,options);
              if (bVar1) {
                ::std::__cxx11::string::operator=
                          ((string *)&shader->info_id,"UsdPrimvarReader_float3");
                tinyusdz::value::Value::operator=
                          (&shader->value,(UsdPrimvarReader<std::array<float,_3UL>_> *)local_9ec8);
                bVar1 = false;
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_a040);
                poVar6 = ::std::operator<<((ostream *)local_a040,"[error]");
                poVar6 = ::std::operator<<(poVar6,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                          );
                poVar6 = ::std::operator<<(poVar6,":");
                poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
                poVar6 = ::std::operator<<(poVar6,"():");
                poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x12b4);
                ::std::operator<<(poVar6," ");
                poVar6 = ::std::operator<<((ostream *)local_a040,"Failed to Reconstruct ");
                poVar6 = ::std::operator<<(poVar6,"UsdPrimvarReader_float3");
                ::std::operator<<(poVar6,"\n");
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::operator+(local_a060,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(preader_4.result._actual_type_name.field_2._M_local_buf + 8))
                  ;
                  ::std::__cxx11::string::operator=((string *)err,(string *)local_a060);
                  ::std::__cxx11::string::~string((string *)local_a060);
                  ::std::__cxx11::string::~string
                            ((string *)(preader_4.result._actual_type_name.field_2._M_local_buf + 8)
                            );
                }
                spec_local._7_1_ = 0;
                bVar1 = true;
                ::std::__cxx11::ostringstream::~ostringstream(local_a040);
              }
              UsdPrimvarReader<std::array<float,_3UL>_>::~UsdPrimvarReader
                        ((UsdPrimvarReader<std::array<float,_3UL>_> *)local_9ec8);
              if (bVar1) goto LAB_002dfd54;
            }
            else {
              iVar3 = ::std::__cxx11::string::compare((char *)&attr);
              if (iVar3 == 0) {
                UsdPrimvarReader<std::array<float,_4UL>_>::UsdPrimvarReader
                          ((UsdPrimvarReader<std::array<float,_4UL>_> *)local_aed0);
                bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<std::array<float,4ul>>>
                                  (spec,properties,references,(UsdPrimvarReader_float4 *)local_aed0,
                                   warn,err,options);
                if (bVar1) {
                  ::std::__cxx11::string::operator=
                            ((string *)&shader->info_id,"UsdPrimvarReader_float4");
                  tinyusdz::value::Value::operator=
                            (&shader->value,(UsdPrimvarReader<std::array<float,_4UL>_> *)local_aed0)
                  ;
                  bVar1 = false;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_b048);
                  poVar6 = ::std::operator<<((ostream *)local_b048,"[error]");
                  poVar6 = ::std::operator<<(poVar6,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                            );
                  poVar6 = ::std::operator<<(poVar6,":");
                  poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
                  poVar6 = ::std::operator<<(poVar6,"():");
                  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x12bd);
                  ::std::operator<<(poVar6," ");
                  poVar6 = ::std::operator<<((ostream *)local_b048,"Failed to Reconstruct ");
                  poVar6 = ::std::operator<<(poVar6,"UsdPrimvarReader_float4");
                  ::std::operator<<(poVar6,"\n");
                  if (err != (string *)0x0) {
                    ::std::__cxx11::ostringstream::str();
                    ::std::operator+(local_b068,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(preader_5.result._actual_type_name.field_2._M_local_buf + 8
                                        ));
                    ::std::__cxx11::string::operator=((string *)err,(string *)local_b068);
                    ::std::__cxx11::string::~string((string *)local_b068);
                    ::std::__cxx11::string::~string
                              ((string *)
                               (preader_5.result._actual_type_name.field_2._M_local_buf + 8));
                  }
                  spec_local._7_1_ = 0;
                  bVar1 = true;
                  ::std::__cxx11::ostringstream::~ostringstream(local_b048);
                }
                UsdPrimvarReader<std::array<float,_4UL>_>::~UsdPrimvarReader
                          ((UsdPrimvarReader<std::array<float,_4UL>_> *)local_aed0);
                if (bVar1) goto LAB_002dfd54;
              }
              else {
                iVar3 = ::std::__cxx11::string::compare((char *)&attr);
                if (iVar3 == 0) {
                  UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::UsdPrimvarReader((UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_bee8);
                  bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<std::__cxx11::string>>
                                    (spec,properties,references,
                                     (UsdPrimvarReader_string *)local_bee8,warn,err,options);
                  if (bVar1) {
                    ::std::__cxx11::string::operator=
                              ((string *)&shader->info_id,"UsdPrimvarReader_string");
                    tinyusdz::value::Value::operator=
                              (&shader->value,
                               (UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_bee8);
                    bVar1 = false;
                  }
                  else {
                    ::std::__cxx11::ostringstream::ostringstream(local_c060);
                    poVar6 = ::std::operator<<((ostream *)local_c060,"[error]");
                    poVar6 = ::std::operator<<(poVar6,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                              );
                    poVar6 = ::std::operator<<(poVar6,":");
                    poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
                    poVar6 = ::std::operator<<(poVar6,"():");
                    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x12c6);
                    ::std::operator<<(poVar6," ");
                    poVar6 = ::std::operator<<((ostream *)local_c060,"Failed to Reconstruct ");
                    poVar6 = ::std::operator<<(poVar6,"UsdPrimvarReader_string");
                    ::std::operator<<(poVar6,"\n");
                    if (err != (string *)0x0) {
                      ::std::__cxx11::ostringstream::str();
                      ::std::operator+(local_c080,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(preader_6.result._actual_type_name.field_2._M_local_buf +
                                          8));
                      ::std::__cxx11::string::operator=((string *)err,(string *)local_c080);
                      ::std::__cxx11::string::~string((string *)local_c080);
                      ::std::__cxx11::string::~string
                                ((string *)
                                 (preader_6.result._actual_type_name.field_2._M_local_buf + 8));
                    }
                    spec_local._7_1_ = 0;
                    bVar1 = true;
                    ::std::__cxx11::ostringstream::~ostringstream(local_c060);
                  }
                  UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~UsdPrimvarReader((UsdPrimvarReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_bee8);
                  if (bVar1) goto LAB_002dfd54;
                }
                else {
                  iVar3 = ::std::__cxx11::string::compare((char *)&attr);
                  if (iVar3 == 0) {
                    UsdPrimvarReader<tinyusdz::value::vector3f>::UsdPrimvarReader
                              ((UsdPrimvarReader<tinyusdz::value::vector3f> *)local_cee8);
                    bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::vector3f>>
                                      (spec,properties,references,
                                       (UsdPrimvarReader_vector *)local_cee8,warn,err,options);
                    if (bVar1) {
                      ::std::__cxx11::string::operator=
                                ((string *)&shader->info_id,"UsdPrimvarReader_vector");
                      tinyusdz::value::Value::operator=
                                (&shader->value,
                                 (UsdPrimvarReader<tinyusdz::value::vector3f> *)local_cee8);
                      bVar1 = false;
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream(local_d060);
                      poVar6 = ::std::operator<<((ostream *)local_d060,"[error]");
                      poVar6 = ::std::operator<<(poVar6,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                );
                      poVar6 = ::std::operator<<(poVar6,":");
                      poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
                      poVar6 = ::std::operator<<(poVar6,"():");
                      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x12cf);
                      ::std::operator<<(poVar6," ");
                      poVar6 = ::std::operator<<((ostream *)local_d060,"Failed to Reconstruct ");
                      poVar6 = ::std::operator<<(poVar6,"UsdPrimvarReader_vector");
                      ::std::operator<<(poVar6,"\n");
                      if (err != (string *)0x0) {
                        ::std::__cxx11::ostringstream::str();
                        ::std::operator+(local_d080,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(preader_7.result._actual_type_name.field_2._M_local_buf
                                            + 8));
                        ::std::__cxx11::string::operator=((string *)err,(string *)local_d080);
                        ::std::__cxx11::string::~string((string *)local_d080);
                        ::std::__cxx11::string::~string
                                  ((string *)
                                   (preader_7.result._actual_type_name.field_2._M_local_buf + 8));
                      }
                      spec_local._7_1_ = 0;
                      bVar1 = true;
                      ::std::__cxx11::ostringstream::~ostringstream(local_d060);
                    }
                    UsdPrimvarReader<tinyusdz::value::vector3f>::~UsdPrimvarReader
                              ((UsdPrimvarReader<tinyusdz::value::vector3f> *)local_cee8);
                    if (bVar1) goto LAB_002dfd54;
                  }
                  else {
                    iVar3 = ::std::__cxx11::string::compare((char *)&attr);
                    if (iVar3 == 0) {
                      UsdPrimvarReader<tinyusdz::value::normal3f>::UsdPrimvarReader
                                ((UsdPrimvarReader<tinyusdz::value::normal3f> *)local_dee8);
                      bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>>
                                        (spec,properties,references,
                                         (UsdPrimvarReader_normal *)local_dee8,warn,err,options);
                      if (bVar1) {
                        ::std::__cxx11::string::operator=
                                  ((string *)&shader->info_id,"UsdPrimvarReader_normal");
                        tinyusdz::value::Value::operator=
                                  (&shader->value,
                                   (UsdPrimvarReader<tinyusdz::value::normal3f> *)local_dee8);
                        bVar1 = false;
                      }
                      else {
                        ::std::__cxx11::ostringstream::ostringstream(local_e060);
                        poVar6 = ::std::operator<<((ostream *)local_e060,"[error]");
                        poVar6 = ::std::operator<<(poVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                        poVar6 = ::std::operator<<(poVar6,":");
                        poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
                        poVar6 = ::std::operator<<(poVar6,"():");
                        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x12d8);
                        ::std::operator<<(poVar6," ");
                        poVar6 = ::std::operator<<((ostream *)local_e060,"Failed to Reconstruct ");
                        poVar6 = ::std::operator<<(poVar6,"UsdPrimvarReader_normal");
                        ::std::operator<<(poVar6,"\n");
                        if (err != (string *)0x0) {
                          ::std::__cxx11::ostringstream::str();
                          ::std::operator+(local_e080,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(preader_8.result._actual_type_name.field_2.
                                               _M_local_buf + 8));
                          ::std::__cxx11::string::operator=((string *)err,(string *)local_e080);
                          ::std::__cxx11::string::~string((string *)local_e080);
                          ::std::__cxx11::string::~string
                                    ((string *)
                                     (preader_8.result._actual_type_name.field_2._M_local_buf + 8));
                        }
                        spec_local._7_1_ = 0;
                        bVar1 = true;
                        ::std::__cxx11::ostringstream::~ostringstream(local_e060);
                      }
                      UsdPrimvarReader<tinyusdz::value::normal3f>::~UsdPrimvarReader
                                ((UsdPrimvarReader<tinyusdz::value::normal3f> *)local_dee8);
                      if (bVar1) goto LAB_002dfd54;
                    }
                    else {
                      iVar3 = ::std::__cxx11::string::compare((char *)&attr);
                      if (iVar3 == 0) {
                        UsdPrimvarReader<tinyusdz::value::point3f>::UsdPrimvarReader
                                  ((UsdPrimvarReader<tinyusdz::value::point3f> *)local_eee8);
                        bVar1 = ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::point3f>>
                                          (spec,properties,references,
                                           (UsdPrimvarReader_point *)local_eee8,warn,err,options);
                        if (bVar1) {
                          ::std::__cxx11::string::operator=
                                    ((string *)&shader->info_id,"UsdPrimvarReader_point");
                          tinyusdz::value::Value::operator=
                                    (&shader->value,
                                     (UsdPrimvarReader<tinyusdz::value::point3f> *)local_eee8);
                          bVar1 = false;
                        }
                        else {
                          ::std::__cxx11::ostringstream::ostringstream(local_f060);
                          poVar6 = ::std::operator<<((ostream *)local_f060,"[error]");
                          poVar6 = ::std::operator<<(poVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                          poVar6 = ::std::operator<<(poVar6,":");
                          poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
                          poVar6 = ::std::operator<<(poVar6,"():");
                          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x12e1);
                          ::std::operator<<(poVar6," ");
                          poVar6 = ::std::operator<<((ostream *)local_f060,"Failed to Reconstruct ")
                          ;
                          poVar6 = ::std::operator<<(poVar6,"UsdPrimvarReader_point");
                          ::std::operator<<(poVar6,"\n");
                          if (err != (string *)0x0) {
                            ::std::__cxx11::ostringstream::str();
                            ::std::operator+(local_f080,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(transform.result._actual_type_name.field_2.
                                                 _M_local_buf + 8));
                            ::std::__cxx11::string::operator=((string *)err,(string *)local_f080);
                            ::std::__cxx11::string::~string((string *)local_f080);
                            ::std::__cxx11::string::~string
                                      ((string *)
                                       (transform.result._actual_type_name.field_2._M_local_buf + 8)
                                      );
                          }
                          spec_local._7_1_ = 0;
                          bVar1 = true;
                          ::std::__cxx11::ostringstream::~ostringstream(local_f060);
                        }
                        UsdPrimvarReader<tinyusdz::value::point3f>::~UsdPrimvarReader
                                  ((UsdPrimvarReader<tinyusdz::value::point3f> *)local_eee8);
                        if (bVar1) goto LAB_002dfd54;
                      }
                      else {
                        iVar3 = ::std::__cxx11::string::compare((char *)&attr);
                        if (iVar3 == 0) {
                          UsdTransform2d::UsdTransform2d((UsdTransform2d *)auStack_10450);
                          bVar1 = ReconstructShader<tinyusdz::UsdTransform2d>
                                            (spec,properties,references,
                                             (UsdTransform2d *)auStack_10450,warn,err,options);
                          if (bVar1) {
                            ::std::__cxx11::string::operator=
                                      ((string *)&shader->info_id,"UsdTransform2d");
                            tinyusdz::value::Value::operator=
                                      (&shader->value,(UsdTransform2d *)auStack_10450);
                            bVar1 = false;
                          }
                          else {
                            ::std::__cxx11::ostringstream::ostringstream(aoStack_105c8);
                            poVar6 = ::std::operator<<((ostream *)aoStack_105c8,"[error]");
                            poVar6 = ::std::operator<<(poVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                            poVar6 = ::std::operator<<(poVar6,":");
                            poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
                            poVar6 = ::std::operator<<(poVar6,"():");
                            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x12ea);
                            ::std::operator<<(poVar6," ");
                            poVar6 = ::std::operator<<((ostream *)aoStack_105c8,
                                                       "Failed to Reconstruct ");
                            poVar6 = ::std::operator<<(poVar6,"UsdTransform2d");
                            ::std::operator<<(poVar6,"\n");
                            if (err != (string *)0x0) {
                              ::std::__cxx11::ostringstream::str();
                              ::std::operator+(abStack_105e8,
                                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&surface_1.super_UsdShadePrim._properties.
                                                                                                      
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                              );
                              ::std::__cxx11::string::operator=
                                        ((string *)err,(string *)abStack_105e8);
                              ::std::__cxx11::string::~string((string *)abStack_105e8);
                              ::std::__cxx11::string::~string
                                        ((string *)
                                         &surface_1.super_UsdShadePrim._properties.
                                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                            }
                            spec_local._7_1_ = 0;
                            bVar1 = true;
                            ::std::__cxx11::ostringstream::~ostringstream(aoStack_105c8);
                          }
                          UsdTransform2d::~UsdTransform2d((UsdTransform2d *)auStack_10450);
                          if (bVar1) goto LAB_002dfd54;
                        }
                        else {
                          ShaderNode::ShaderNode((ShaderNode *)auStack_10d38);
                          bVar1 = ReconstructShader<tinyusdz::ShaderNode>
                                            (spec,properties,references,(ShaderNode *)auStack_10d38,
                                             warn,err,options);
                          if (bVar1) {
                            lVar7 = ::std::__cxx11::string::size();
                            if (lVar7 != 0) {
                              ::std::__cxx11::string::operator=
                                        ((string *)&shader->info_id,(string *)&attr);
                            }
                            tinyusdz::value::Value::operator=
                                      (&shader->value,(ShaderNode *)auStack_10d38);
                            bVar1 = false;
                          }
                          else {
                            ::std::__cxx11::ostringstream::ostringstream(aoStack_10eb0);
                            poVar6 = ::std::operator<<((ostream *)aoStack_10eb0,"[error]");
                            poVar6 = ::std::operator<<(poVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                  );
                            poVar6 = ::std::operator<<(poVar6,":");
                            poVar6 = ::std::operator<<(poVar6,"ReconstructPrim");
                            poVar6 = ::std::operator<<(poVar6,"():");
                            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x12f3);
                            ::std::operator<<(poVar6," ");
                            poVar6 = ::std::operator<<((ostream *)aoStack_10eb0,
                                                       "Failed to Reconstruct ");
                            poVar6 = ::std::operator<<(poVar6,(string *)&attr);
                            ::std::operator<<(poVar6,"\n");
                            if (err != (string *)0x0) {
                              ::std::__cxx11::ostringstream::str();
                              ::std::operator+(abStack_10ed0,abStack_10ef0);
                              ::std::__cxx11::string::operator=
                                        ((string *)err,(string *)abStack_10ed0);
                              ::std::__cxx11::string::~string((string *)abStack_10ed0);
                              ::std::__cxx11::string::~string((string *)abStack_10ef0);
                            }
                            spec_local._7_1_ = 0;
                            bVar1 = true;
                            ::std::__cxx11::ostringstream::~ostringstream(aoStack_10eb0);
                          }
                          ShaderNode::~ShaderNode((ShaderNode *)auStack_10d38);
                          if (bVar1) goto LAB_002dfd54;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  spec_local._7_1_ = 1;
LAB_002dfd54:
  ::std::__cxx11::string::~string((string *)&attr);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructPrim<Shader>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Shader *shader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)properties;
  (void)options;

  bool is_generic_shader{false};
  auto info_id_prop = properties.find("info:id");
  if (info_id_prop == properties.end()) {
    // Guess MatrialX shader. info:id will be resolved by importing referenced .mtlx.
    // Treat generic Shader at the moment.
    is_generic_shader = true;
    //PUSH_ERROR_AND_RETURN("`Shader` must contain `info:id` property.");
  }

  std::string shader_type;
  if (!is_generic_shader) {
    if (info_id_prop->second.is_attribute()) {
      const Attribute &attr = info_id_prop->second.get_attribute();
      if ((attr.type_name() == value::kToken)) {
        if (auto pv = attr.get_value<value::token>()) {
          shader_type = pv.value().str();
        } else {
          PUSH_ERROR_AND_RETURN("Internal errror. `info:id` has invalid type.");
        }
      } else {
        PUSH_ERROR_AND_RETURN("`info:id` attribute must be `token` type.");
      }

      // For some corrupted? USDZ file does not have `uniform` variability.
      if (attr.variability() != Variability::Uniform) {
        PUSH_WARN("`info:id` attribute must have `uniform` variability.");
      }
    } else {
      PUSH_ERROR_AND_RETURN("Invalid type or value for `info:id` property in `Shader`.");
    }

    DCOUT("info:id = " << shader_type);
  }


  if (shader_type.compare(kUsdPreviewSurface) == 0) {
    UsdPreviewSurface surface;
    if (!ReconstructShader<UsdPreviewSurface>(spec, properties, references,
                                              &surface, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct " << kUsdPreviewSurface);
    }
    shader->info_id = kUsdPreviewSurface;
    shader->value = surface;
    DCOUT("info_id = " << shader->info_id);
  } else if (shader_type.compare(kUsdUVTexture) == 0) {
    UsdUVTexture texture;
    if (!ReconstructShader<UsdUVTexture>(spec, properties, references,
                                         &texture, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct " << kUsdUVTexture);
    }
    shader->info_id = kUsdUVTexture;
    shader->value = texture;
  } else if (shader_type.compare(kUsdPrimvarReader_int) == 0) {
    UsdPrimvarReader_int preader;
    if (!ReconstructShader<UsdPrimvarReader_int>(spec, properties, references,
                                                 &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_int);
    }
    shader->info_id = kUsdPrimvarReader_int;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_float) == 0) {
    UsdPrimvarReader_float preader;
    if (!ReconstructShader<UsdPrimvarReader_float>(spec, properties, references,
                                                   &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_float);
    }
    shader->info_id = kUsdPrimvarReader_float;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_float2) == 0) {
    UsdPrimvarReader_float2 preader;
    if (!ReconstructShader<UsdPrimvarReader_float2>(spec, properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_float2);
    }
    shader->info_id = kUsdPrimvarReader_float2;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_float3) == 0) {
    UsdPrimvarReader_float3 preader;
    if (!ReconstructShader<UsdPrimvarReader_float3>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_float3);
    }
    shader->info_id = kUsdPrimvarReader_float3;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_float4) == 0) {
    UsdPrimvarReader_float4 preader;
    if (!ReconstructShader<UsdPrimvarReader_float4>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_float4);
    }
    shader->info_id = kUsdPrimvarReader_float4;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_string) == 0) {
    UsdPrimvarReader_string preader;
    if (!ReconstructShader<UsdPrimvarReader_string>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_string);
    }
    shader->info_id = kUsdPrimvarReader_string;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_vector) == 0) {
    UsdPrimvarReader_vector preader;
    if (!ReconstructShader<UsdPrimvarReader_vector>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_vector);
    }
    shader->info_id = kUsdPrimvarReader_vector;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_normal) == 0) {
    UsdPrimvarReader_normal preader;
    if (!ReconstructShader<UsdPrimvarReader_normal>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_normal);
    }
    shader->info_id = kUsdPrimvarReader_normal;
    shader->value = preader;
  } else if (shader_type.compare(kUsdPrimvarReader_point) == 0) {
    UsdPrimvarReader_point preader;
    if (!ReconstructShader<UsdPrimvarReader_point>(spec,properties, references,
                                                    &preader, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdPrimvarReader_point);
    }
    shader->info_id = kUsdPrimvarReader_point;
    shader->value = preader;
  } else if (shader_type.compare(kUsdTransform2d) == 0) {
    UsdTransform2d transform;
    if (!ReconstructShader<UsdTransform2d>(spec,properties, references,
                                                    &transform, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct "
                            << kUsdTransform2d);
    }
    shader->info_id = kUsdTransform2d;
    shader->value = transform;
  } else {
    // Reconstruct as generic ShaderNode
    ShaderNode surface;
    if (!ReconstructShader<ShaderNode>(spec,properties, references,
                                              &surface, warn, err, options)) {
      PUSH_ERROR_AND_RETURN("Failed to Reconstruct " << shader_type);
    }
    if (shader_type.size()) {
      shader->info_id = shader_type;
    }
    shader->value = surface;
  }

  DCOUT("Shader reconstructed.");

  return true;
}